

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O0

bool QStyleHelper::hasAncestor(QObject *obj,Role role)

{
  bool bVar1;
  undefined4 in_ESI;
  long in_RDI;
  QObject *parent;
  bool found;
  undefined1 local_21;
  undefined8 local_20;
  uint3 in_stack_fffffffffffffff0;
  uint uVar2;
  byte bVar3;
  
  uVar2 = (uint)in_stack_fffffffffffffff0;
  if (in_RDI == 0) {
    local_20 = (QObject *)0x0;
  }
  else {
    local_20 = QObject::parent((QObject *)0x416558);
  }
  while( true ) {
    local_21 = 0;
    bVar3 = (byte)(uVar2 >> 0x18);
    if (local_20 != (QObject *)0x0) {
      local_21 = bVar3 ^ 0xff;
    }
    if ((local_21 & 1) == 0) break;
    bVar1 = isInstanceOf((QObject *)CONCAT44(in_ESI,uVar2),(Role)((ulong)local_20 >> 0x20));
    if (bVar1) {
      uVar2 = CONCAT13(1,(int3)uVar2);
    }
    local_20 = QObject::parent((QObject *)0x4165b7);
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool hasAncestor(QObject *obj, QAccessible::Role role)
{
    bool found = false;
    QObject *parent = obj ? obj->parent() : nullptr;
    while (parent && !found) {
        if (isInstanceOf(parent, role))
            found = true;
        parent = parent->parent();
    }
    return found;
}